

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::string_t,duckdb::string_t,duckdb::string_t,bool,duckdb::TernaryLambdaWrapper,bool(*)(duckdb::string_t,duckdb::string_t,duckdb::string_t)>
               (string_t *adata,string_t *bdata,string_t *cdata,bool *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,_func_bool_string_t_string_t_string_t *fun)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t i;
  ulong uVar4;
  idx_t row_idx;
  ulong uVar5;
  idx_t row_idx_00;
  idx_t row_idx_01;
  idx_t i_1;
  idx_t row_idx_02;
  string_t sVar6;
  string_t sVar7;
  string_t sVar8;
  string_t sVar9;
  string_t sVar10;
  string_t sVar11;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = uVar4;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)asel->sel_vector[uVar4];
      }
      uVar3 = uVar4;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)bsel->sel_vector[uVar4];
      }
      uVar5 = uVar4;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)csel->sel_vector[uVar4];
      }
      sVar6.value.pointer.ptr = adata[uVar2].value.pointer.ptr;
      sVar6.value._0_8_ = *(undefined8 *)&adata[uVar2].value;
      sVar8.value.pointer.ptr = bdata[uVar3].value.pointer.ptr;
      sVar8.value._0_8_ = *(undefined8 *)&bdata[uVar3].value;
      sVar10.value.pointer.ptr = cdata[uVar5].value.pointer.ptr;
      sVar10.value._0_8_ = *(undefined8 *)&cdata[uVar5].value;
      bVar1 = (*fun)(sVar6,sVar8,sVar10);
      result_data[uVar4] = bVar1;
    }
  }
  else {
    for (row_idx_02 = 0; count != row_idx_02; row_idx_02 = row_idx_02 + 1) {
      row_idx = row_idx_02;
      if (asel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)asel->sel_vector[row_idx_02];
      }
      row_idx_01 = row_idx_02;
      if (bsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)bsel->sel_vector[row_idx_02];
      }
      row_idx_00 = row_idx_02;
      if (csel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)csel->sel_vector[row_idx_02];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&avalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar1) goto LAB_01861fe3;
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
        if (!bVar1) goto LAB_01861fe3;
        sVar7.value.pointer.ptr = adata[row_idx].value.pointer.ptr;
        sVar7.value._0_8_ = *(undefined8 *)&adata[row_idx].value;
        sVar9.value.pointer.ptr = bdata[row_idx_01].value.pointer.ptr;
        sVar9.value._0_8_ = *(undefined8 *)&bdata[row_idx_01].value;
        sVar11.value.pointer.ptr = cdata[row_idx_00].value.pointer.ptr;
        sVar11.value._0_8_ = *(undefined8 *)&cdata[row_idx_00].value;
        bVar1 = (*fun)(sVar7,sVar9,sVar11);
        result_data[row_idx_02] = bVar1;
      }
      else {
LAB_01861fe3:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx_02);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}